

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Board.cpp
# Opt level: O1

void __thiscall Board::print_hand(Board *this,Hand *hand)

{
  ostream *poVar1;
  pointer this_00;
  string local_50;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Printing hand....",0x11)
  ;
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x38);
  std::ostream::put(-0x38);
  std::ostream::flush();
  this_00 = (hand->super__Vector_base<Card,_std::allocator<Card>_>)._M_impl.super__Vector_impl_data.
            _M_start;
  if (this_00 !=
      (hand->super__Vector_base<Card,_std::allocator<Card>_>)._M_impl.super__Vector_impl_data.
      _M_finish) {
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Card is ",8);
      Card::Card2Str_abi_cxx11_(&local_50,this_00);
      poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,local_50._M_dataplus._M_p,local_50._M_string_length)
      ;
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
      std::ostream::put((char)poVar1);
      std::ostream::flush();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      this_00 = this_00 + 1;
    } while (this_00 !=
             (hand->super__Vector_base<Card,_std::allocator<Card>_>)._M_impl.super__Vector_impl_data
             ._M_finish);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"....",4);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x38);
  std::ostream::put(-0x38);
  std::ostream::flush();
  return;
}

Assistant:

void Board::print_hand(Hand hand)
{
  std::cout << "Printing hand...." << std::endl;
  for(std::vector<Card>::iterator it = hand.begin(); it != hand.end(); ++it) {
    std::cout << "Card is " << it->Card2Str() << std::endl;
  }
  std::cout << "...." << std::endl;
}